

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setEnterBound4Row(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,int i,int n)

{
  Status SVar1;
  pointer pnVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  pointer pnVar7;
  byte bVar8;
  cpp_dec_float<200U,_int,_void> cStack_a8;
  
  bVar8 = 0;
  SVar1 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.rowstat.data[n];
  if (SVar1 == P_FIXED) {
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,-*pdVar3,(type *)0x0);
    pnVar2 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0x1c;
    pcVar6 = &cStack_a8;
    pnVar7 = pnVar2 + i;
    for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar8 * -2 + 1) * 4);
      pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = cStack_a8.exp;
    pnVar2[i].m_backend.neg = cStack_a8.neg;
    pnVar2[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar2[i].m_backend.prec_elem = cStack_a8.prec_elem;
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,*pdVar3,(type *)0x0);
    pnVar2 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = &cStack_a8;
    pnVar7 = pnVar2 + i;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar8 * -2 + 1) * 4);
      pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = cStack_a8.exp;
    pnVar2[i].m_backend.neg = cStack_a8.neg;
    pnVar2[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar2[i].m_backend.prec_elem = cStack_a8.prec_elem;
  }
  else if (SVar1 == P_ON_UPPER) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,*pdVar3,(type *)0x0);
    pnVar2 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = &cStack_a8;
    pnVar7 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar8 * -2 + 1) * 4);
      pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = cStack_a8.exp;
    pnVar2[i].m_backend.neg = cStack_a8.neg;
    pnVar2[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar2[i].m_backend.prec_elem = cStack_a8.prec_elem;
  }
  else {
    if (SVar1 != P_ON_LOWER) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
      return;
    }
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&cStack_a8,-*pdVar3,(type *)0x0);
    pnVar2 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = &cStack_a8;
    pnVar7 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = *(undefined4 *)pcVar6;
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar8 * -2 + 1) * 4);
      pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = cStack_a8.exp;
    pnVar2[i].m_backend.neg = cStack_a8.neg;
    pnVar2[i].m_backend.fpclass = cStack_a8.fpclass;
    pnVar2[i].m_backend.prec_elem = cStack_a8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[n].m_backend);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}